

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::javanano::FileGenerator::Validate(FileGenerator *this,string *error)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  __type _Var3;
  __type _Var4;
  ostream *poVar5;
  int i;
  long lVar6;
  bool bVar7;
  long lVar8;
  FileDescriptorProto file_proto;
  
  FileDescriptorProto::FileDescriptorProto(&file_proto);
  FileDescriptor::CopyTo(this->file_,&file_proto);
  bVar2 = anon_unknown_4::UsesExtensions(&file_proto.super_Message);
  if ((bVar2) && (this->params_->store_unknown_fields_ == false)) {
    std::__cxx11::string::_M_assign((string *)error);
  }
  else {
    if ((*(int *)(this->file_ + 0x78) == 0) || (this->params_->ignore_services_ != false)) {
      bVar2 = IsOuterClassNeeded(this->params_,this->file_);
      bVar7 = true;
      if (bVar2) {
        bVar2 = Params::has_java_outer_classname(this->params_,*(string **)this->file_);
        if ((((!bVar2) && (pFVar1 = this->file_, *(int *)(pFVar1 + 0x58) == 1)) &&
            (*(int *)(pFVar1 + 0x68) == 0)) && (*(int *)(pFVar1 + 0x88) == 0)) {
          poVar5 = std::operator<<((ostream *)&std::cout,"INFO: ");
          poVar5 = std::operator<<(poVar5,*(string **)this->file_);
          poVar5 = std::operator<<(poVar5,":");
          std::endl<char,std::char_traits<char>>(poVar5);
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "Javanano generator has changed to align with java generator. An outer class will be created for this file and the single message in the file will become a nested class. Use java_multiple_files to skip generating the outer class, or set an explicit java_outer_classname to suppress this message."
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        lVar8 = 0;
        _Var4 = false;
        for (lVar6 = 0; (!_Var4 && (lVar6 < *(int *)(this->file_ + 0x58))); lVar6 = lVar6 + 1) {
          _Var3 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(*(long *)(this->file_ + 0x60) + lVar8),&this->classname_);
          if (_Var3) {
            _Var4 = true;
          }
          lVar8 = lVar8 + 0xa8;
        }
        if (this->params_->java_enum_style_ == true) {
          lVar8 = 0;
          for (lVar6 = 0; (_Var4 == false && (lVar6 < *(int *)(this->file_ + 0x68)));
              lVar6 = lVar6 + 1) {
            _Var4 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)(*(long *)(this->file_ + 0x70) + lVar8),&this->classname_);
            lVar8 = lVar8 + 0x38;
          }
        }
        if (_Var4 != false) {
          std::__cxx11::string::_M_assign((string *)error);
          std::__cxx11::string::append((char *)error);
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::append((char *)error);
        }
        bVar7 = (bool)(_Var4 ^ 1);
      }
      goto LAB_00296c2f;
    }
    std::__cxx11::string::_M_assign((string *)error);
  }
  std::__cxx11::string::append((char *)error);
  bVar7 = false;
LAB_00296c2f:
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return bVar7;
}

Assistant:

bool FileGenerator::Validate(string* error) {
  // Check for extensions
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  if (UsesExtensions(file_proto) && !params_.store_unknown_fields()) {
    error->assign(file_->name());
    error->append(
        ": Java NANO_RUNTIME only supports extensions when the "
        "'store_unknown_fields' generator option is 'true'.");
    return false;
  }

  if (file_->service_count() != 0 && !params_.ignore_services()) {
    error->assign(file_->name());
    error->append(
      ": Java NANO_RUNTIME does not support services\"");
    return false;
  }

  if (!IsOuterClassNeeded(params_, file_)) {
    return true;
  }

  // Check whether legacy javanano generator would omit the outer class.
  if (!params_.has_java_outer_classname(file_->name())
      && file_->message_type_count() == 1
      && file_->enum_type_count() == 0 && file_->extension_count() == 0) {
    cout << "INFO: " << file_->name() << ":" << endl;
    cout << "Javanano generator has changed to align with java generator. "
        "An outer class will be created for this file and the single message "
        "in the file will become a nested class. Use java_multiple_files to "
        "skip generating the outer class, or set an explicit "
        "java_outer_classname to suppress this message." << endl;
  }

  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  bool found_conflict = false;
  for (int i = 0; !found_conflict && i < file_->message_type_count(); i++) {
    if (file_->message_type(i)->name() == classname_) {
      found_conflict = true;
    }
  }
  if (params_.java_enum_style()) {
    for (int i = 0; !found_conflict && i < file_->enum_type_count(); i++) {
      if (file_->enum_type(i)->name() == classname_) {
        found_conflict = true;
      }
    }
  }
  if (found_conflict) {
    error->assign(file_->name());
    error->append(
      ": Cannot generate Java output because the file's outer class name, \"");
    error->append(classname_);
    error->append(
      "\", matches the name of one of the types declared inside it.  "
      "Please either rename the type or use the java_outer_classname "
      "option to specify a different outer class name for the .proto file.");
    return false;
  }
  return true;
}